

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsEqualPrecision4Switched_Test::~Equality_unitsEqualPrecision4Switched_Test
          (Equality_unitsEqualPrecision4Switched_Test *this)

{
  Equality_unitsEqualPrecision4Switched_Test *this_local;
  
  ~Equality_unitsEqualPrecision4Switched_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsEqualPrecision4Switched)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 238487722399.29383);
    u2->addUnit("second", 238487722399.29384);

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}